

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_uuencode.c
# Opt level: O0

int archive_filter_uuencode_close(archive_write_filter *f)

{
  void *pvVar1;
  int iVar2;
  private_uuencode *state;
  archive_write_filter *f_local;
  
  pvVar1 = f->data;
  if (*(long *)((long)pvVar1 + 0x40) != 0) {
    uu_encode((archive_string *)((long)pvVar1 + 0x20),(uchar *)((long)pvVar1 + 0x48),
              *(size_t *)((long)pvVar1 + 0x40));
  }
  archive_string_sprintf((archive_string *)((long)pvVar1 + 0x20),"`\nend\n");
  archive_write_set_bytes_in_last_block(f->archive,1);
  iVar2 = __archive_write_filter
                    (f->next_filter,*(void **)((long)pvVar1 + 0x20),*(size_t *)((long)pvVar1 + 0x28)
                    );
  return iVar2;
}

Assistant:

static int
archive_filter_uuencode_close(struct archive_write_filter *f)
{
	struct private_uuencode *state = (struct private_uuencode *)f->data;

	/* Flush remaining bytes. */
	if (state->hold_len != 0)
		uu_encode(&state->encoded_buff, state->hold, state->hold_len);
	archive_string_sprintf(&state->encoded_buff, "`\nend\n");
	/* Write the last block */
	archive_write_set_bytes_in_last_block(f->archive, 1);
	return __archive_write_filter(f->next_filter,
	    state->encoded_buff.s, archive_strlen(&state->encoded_buff));
}